

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

bool ExpressionRunnerSetGlobalValue
               (ExpressionRunnerRef runner,char *name,BinaryenExpressionRef value)

{
  undefined1 local_78 [8];
  Flow setFlow;
  
  wasm::ExpressionRunner<wasm::CExpressionRunner>::visit
            ((Flow *)local_78,(ExpressionRunner<wasm::CExpressionRunner> *)runner,value);
  if (setFlow.breakTo.super_IString.str._M_len == 0) {
    wasm::Name::Name((Name *)&setFlow.breakTo.super_IString.str._M_str,name);
    wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::setGlobalValue
              (&runner->super_ConstantExpressionRunner<wasm::CExpressionRunner>,
               (Name)stack0xffffffffffffffd0,(Literals *)local_78);
  }
  wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_78);
  return setFlow.breakTo.super_IString.str._M_len == 0;
}

Assistant:

bool ExpressionRunnerSetGlobalValue(ExpressionRunnerRef runner,
                                    const char* name,
                                    BinaryenExpressionRef value) {
  auto* R = (CExpressionRunner*)runner;
  auto setFlow = R->visit(value);
  if (!setFlow.breaking()) {
    R->setGlobalValue(name, setFlow.values);
    return 1;
  }
  return 0;
}